

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<double>(CImg<unsigned_char> *this,double *min_val)

{
  byte bVar1;
  byte *pbVar2;
  undefined4 in_EAX;
  undefined4 uVar3;
  uint uVar4;
  byte *pbVar5;
  CImgInstanceException *this_00;
  byte bVar6;
  byte *pbVar7;
  byte bVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  
  pbVar2 = this->_data;
  if (pbVar2 != (byte *)0x0) {
    auVar10._0_4_ = -(uint)(this->_width == 0);
    auVar10._4_4_ = -(uint)(this->_height == 0);
    auVar10._8_4_ = -(uint)(this->_depth == 0);
    auVar10._12_4_ = -(uint)(this->_spectrum == 0);
    uVar3 = movmskps(in_EAX,auVar10);
    if ((char)uVar3 == '\0') {
      bVar6 = *pbVar2;
      uVar4 = this->_depth * this->_height * this->_width * this->_spectrum;
      pbVar5 = pbVar2;
      if (uVar4 != 0) {
        pbVar7 = pbVar2 + uVar4;
        bVar8 = bVar6;
        do {
          pbVar7 = pbVar7 + -1;
          bVar1 = *pbVar7;
          if (bVar8 < bVar1) {
            pbVar5 = pbVar7;
            bVar8 = bVar1;
          }
          if (bVar1 < bVar6) {
            bVar6 = bVar1;
          }
        } while (pbVar2 < pbVar7);
      }
      *min_val = (double)bVar6;
      return pbVar5;
    }
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar9 = "non-";
  if (this->_is_shared != false) {
    pcVar9 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min() : Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar9,"unsigned char");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min() : Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }